

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vertex.h
# Opt level: O3

Vertex * Assimp::Vertex::BinaryOp<Assimp::Intern::multiplies>
                   (Vertex *__return_storage_ptr__,Vertex *v0,ai_real f)

{
  float *pfVar1;
  float fVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined8 uVar7;
  undefined8 uVar8;
  long lVar13;
  
  lVar13 = 0;
  memset(__return_storage_ptr__->texcoords,0,0xe0);
  uVar3 = (v0->position).x;
  uVar9 = (v0->position).y;
  fVar2 = (v0->position).z;
  (__return_storage_ptr__->position).x = (float)uVar3 * f;
  (__return_storage_ptr__->position).y = (float)uVar9 * f;
  (__return_storage_ptr__->position).z = fVar2 * f;
  uVar4 = (v0->normal).x;
  uVar10 = (v0->normal).y;
  fVar2 = (v0->normal).z;
  (__return_storage_ptr__->normal).x = (float)uVar4 * f;
  (__return_storage_ptr__->normal).y = (float)uVar10 * f;
  (__return_storage_ptr__->normal).z = fVar2 * f;
  uVar5 = (v0->tangent).x;
  uVar11 = (v0->tangent).y;
  fVar2 = (v0->tangent).z;
  (__return_storage_ptr__->tangent).x = (float)uVar5 * f;
  (__return_storage_ptr__->tangent).y = (float)uVar11 * f;
  (__return_storage_ptr__->tangent).z = fVar2 * f;
  uVar6 = (v0->bitangent).x;
  uVar12 = (v0->bitangent).y;
  fVar2 = (v0->bitangent).z;
  (__return_storage_ptr__->bitangent).x = (float)uVar6 * f;
  (__return_storage_ptr__->bitangent).y = (float)uVar12 * f;
  (__return_storage_ptr__->bitangent).z = fVar2 * f;
  do {
    uVar7 = *(undefined8 *)((long)&v0->texcoords[0].x + lVar13);
    fVar2 = *(float *)((long)&v0->texcoords[0].z + lVar13);
    *(ulong *)((long)&__return_storage_ptr__->texcoords[0].x + lVar13) =
         CONCAT44((float)((ulong)uVar7 >> 0x20) * f,(float)uVar7 * f);
    *(float *)((long)&__return_storage_ptr__->texcoords[0].z + lVar13) = fVar2 * f;
    lVar13 = lVar13 + 0xc;
  } while (lVar13 != 0x60);
  lVar13 = 0;
  do {
    uVar7 = *(undefined8 *)((long)&v0->colors[0].r + lVar13);
    uVar8 = *(undefined8 *)((long)&v0->colors[0].b + lVar13);
    pfVar1 = (float *)((long)&__return_storage_ptr__->colors[0].r + lVar13);
    *pfVar1 = (float)uVar7 * f;
    pfVar1[1] = (float)((ulong)uVar7 >> 0x20) * f;
    pfVar1[2] = (float)uVar8 * f;
    pfVar1[3] = (float)((ulong)uVar8 >> 0x20) * f;
    lVar13 = lVar13 + 0x10;
  } while (lVar13 != 0x80);
  return __return_storage_ptr__;
}

Assistant:

static Vertex BinaryOp(const Vertex& v0, ai_real f) {
        // this is a heavy task for the compiler to optimize ... *pray*

        Vertex res;
        res.position  = op<aiVector3D,ai_real,aiVector3D>()(v0.position,f);
        res.normal    = op<aiVector3D,ai_real,aiVector3D>()(v0.normal,f);
        res.tangent   = op<aiVector3D,ai_real,aiVector3D>()(v0.tangent,f);
        res.bitangent = op<aiVector3D,ai_real,aiVector3D>()(v0.bitangent,f);

        for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++i) {
            res.texcoords[i] = op<aiVector3D,ai_real,aiVector3D>()(v0.texcoords[i],f);
        }
        for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_COLOR_SETS; ++i) {
            res.colors[i] = op<aiColor4D,ai_real,aiColor4D>()(v0.colors[i],f);
        }
        return res;
    }